

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

uint32 lzham::lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)

{
  undefined8 *in_RDI;
  lzham_malloc_context malloc_context;
  uint32 adler32;
  lzham_decompressor *pState;
  lzham_decompressor *p_00;
  undefined4 in_stack_ffffffffffffffe0;
  uint32 local_4;
  
  if (in_RDI == (undefined8 *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = *(uint32 *)(in_RDI + 0x1f);
    p_00 = (lzham_decompressor *)*in_RDI;
    lzham_free((lzham_malloc_context)CONCAT44(local_4,in_stack_ffffffffffffffe0),p_00);
    lzham_delete<lzham::lzham_decompressor>
              ((lzham_malloc_context)CONCAT44(local_4,in_stack_ffffffffffffffe0),p_00);
    lzham_destroy_malloc_context((lzham_malloc_context)CONCAT44(local_4,in_stack_ffffffffffffffe0));
  }
  return local_4;
}

Assistant:

uint32 LZHAM_CDECL lzham_lib_decompress_deinit(lzham_decompress_state_ptr p)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);
      if (!pState)
         return 0;

      uint32 adler32 = pState->m_decomp_adler32;

      lzham_malloc_context malloc_context = pState->m_malloc_context;

      lzham_free(malloc_context, pState->m_pRaw_decomp_buf);
      lzham_delete(malloc_context, pState);
      lzham_destroy_malloc_context(malloc_context);

      return adler32;
   }